

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_Dsd6DecomposeDoubleVars(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  bool bVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  int local_40;
  int nVarsOld;
  int u;
  int v;
  abctime clk;
  int nVars_local;
  int *pVars_local;
  word *pTruth_local;
  Dau_Dsd_t *p_local;
  
  aVar3 = Abc_Clock();
  clk._4_4_ = nVars;
LAB_00634729:
  do {
    nVarsOld = nVars + -1;
    if (0 < nVarsOld) {
      for (local_40 = nVars + -2; -1 < local_40; local_40 = local_40 + -1) {
        iVar2 = Dau_DsdLookupVarCache(p,pVars[nVarsOld],pVars[local_40]);
        if (iVar2 == 0) {
          iVar2 = Dau_Dsd6DecomposeDoubleVarsOne(p,pTruth,pVars,clk._4_4_,nVarsOld,local_40);
          if (iVar2 == 0) {
            aVar4 = Abc_Clock();
            s_Times[1] = (aVar4 - aVar3) + s_Times[1];
            return 0;
          }
          bVar1 = iVar2 < clk._4_4_;
          clk._4_4_ = iVar2;
          if (bVar1) break;
        }
      }
      nVars = nVarsOld;
      if (local_40 < 0) goto LAB_00634729;
    }
    nVars = clk._4_4_;
    if (nVarsOld == 0) {
      aVar4 = Abc_Clock();
      s_Times[1] = (aVar4 - aVar3) + s_Times[1];
      return clk._4_4_;
    }
  } while( true );
}

Assistant:

int Dau_Dsd6DecomposeDoubleVars( Dau_Dsd_t * p, word  * pTruth, int * pVars, int nVars )
{
    abctime clk = Abc_Clock();
    while ( 1 )
    {
        int v, u, nVarsOld;
        for ( v = nVars - 1; v > 0; v-- )
        {
            for ( u = v - 1; u >= 0; u-- )
            {
                if ( Dau_DsdLookupVarCache( p, pVars[v], pVars[u] ) )
                    continue;
                nVarsOld = nVars;
                nVars = Dau_Dsd6DecomposeDoubleVarsOne( p, pTruth, pVars, nVars, v, u );
                if ( nVars == 0 )
                {
                    s_Times[1] += Abc_Clock() - clk;
                    return 0;
                }
                if ( nVarsOld > nVars )
                    break;
            }
            if ( u >= 0 ) // found
                break;
        }
        if ( v == 0 ) // not found
            break;
    }
    s_Times[1] += Abc_Clock() - clk;
    return nVars;
}